

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O1

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_node
          (DG2Dot<dg::LLVMNode> *this,LLVMNode *node,int ind,char *prefix)

{
  ofstream *poVar1;
  _Rb_tree_header *p_Var2;
  uint32_t uVar3;
  uint uVar4;
  ostream *poVar5;
  size_t sVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  _Base_ptr p_Var10;
  int iVar11;
  char *pcVar12;
  
  uVar3 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).slice_id;
  uVar4 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).analysisAuxData.
          dfsorder;
  poVar1 = &this->out;
  iVar11 = ind;
  if (0 < ind) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
  poVar5 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," [label=\"",9);
  if (prefix != (char *)0x0) {
    sVar6 = strlen(prefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,prefix,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
  }
  (**this->_vptr_DG2Dot)
            (this,poVar1,
             (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key);
  if ((node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t.
      _M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\nsubgraphs: ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (uVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\ndfs order: ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\nbfs order: ",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (uVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\nslice: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  iVar11 = (*this->_vptr_DG2Dot[1])(this,poVar1,node);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\" ",2);
  if ((char)iVar11 == '\0') {
    p_Var2 = &(this->criteria)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = (this->criteria)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &p_Var2->_M_header;
    for (; p_Var10 != (_Base_ptr)0x0;
        p_Var10 = (&p_Var10->_M_left)[*(LLVMNode **)(p_Var10 + 1) < node]) {
      if (*(LLVMNode **)(p_Var10 + 1) >= node) {
        p_Var8 = p_Var10;
      }
    }
    p_Var10 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var8 != p_Var2) &&
       (p_Var10 = p_Var8, node < *(LLVMNode **)(p_Var8 + 1))) {
      p_Var10 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var10 == p_Var2) {
      if (uVar3 == 0) {
        pcVar12 = "style=filled fillcolor=white";
        lVar9 = 0x1c;
      }
      else {
        pcVar12 = "style=filled fillcolor=greenyellow";
        lVar9 = 0x22;
      }
    }
    else {
      pcVar12 = "style=filled fillcolor=orange";
      lVar9 = 0x1d;
    }
  }
  else {
    pcVar12 = "style=filled fillcolor=red";
    lVar9 = 0x1a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar12,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
  dump_parameters(this,node,ind);
  if (((node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t.
       _M_impl.super__Rb_tree_header._M_node_count != 0) && ((this->options & 0x400) != 0)) {
    for (p_Var7 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 !=
        &(node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).subgraphs._M_t.
         _M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      iVar11 = ind;
      if (0 < ind) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\t",1);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NODE",4);
      poVar5 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> NODE",8);
      poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," [label=\"call\"",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  lhead=cluster_",0x10);
      poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," penwidth=3 style=dashed]\n",0x1a);
    }
  }
  return;
}

Assistant:

void dump_node(NodeT *node, int ind = 1, const char *prefix = nullptr) {
        bool err = false;
        unsigned int dfsorder = node->getDFSOrder();
        unsigned int bfsorder = node->getDFSOrder();
        uint32_t slice_id = node->getSlice();
        Indent Ind(ind);

        out << Ind << "NODE" << node << " [label=\"";

        if (prefix)
            out << prefix << " ";

        printKey(out, node->getKey());

        if (node->hasSubgraphs())
            out << "\\nsubgraphs: " << node->subgraphsNum();
        if (dfsorder != 0)
            out << "\\ndfs order: " << dfsorder;
        if (bfsorder != 0)
            out << "\\nbfs order: " << bfsorder;

        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        // check if the node is OK, and if not
        // highlight it
        err = checkNode(out, node);

        // end of label
        out << "\" ";

        if (err) {
            out << "style=filled fillcolor=red";
        } else if (criteria.count(node) > 0) {
            out << "style=filled fillcolor=orange";
        } else if (slice_id != 0)
            out << "style=filled fillcolor=greenyellow";
        else
            out << "style=filled fillcolor=white";

        out << "]\n";

        dump_parameters(node, ind);
        if (node->hasSubgraphs() && (options & PRINT_CALL)) {
            // add call-site to callee edges
            for (auto subgraph : node->getSubgraphs()) {
                out << Ind << "NODE" << node << " -> NODE"
                    << subgraph->getEntry() << " [label=\"call\""
                    << "  lhead=cluster_" << subgraph
                    << " penwidth=3 style=dashed]\n";
            }
        }
    }